

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_copy(mp_int *a,mp_int *b)

{
  uint uVar1;
  mp_digit *pmVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  mp_digit *__s;
  
  if (a != b) {
    if ((a->used <= b->alloc) || (iVar3 = mp_grow(b,a->used), iVar3 == 0)) {
      __s = b->dp;
      uVar1 = a->used;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      else {
        pmVar2 = a->dp;
        lVar5 = 0;
        do {
          *__s = pmVar2[lVar5];
          __s = __s + 1;
          lVar5 = lVar5 + 1;
          uVar4 = uVar1;
        } while (uVar1 != (uint)lVar5);
      }
      if ((int)uVar4 < b->used) {
        memset(__s,0,(ulong)(b->used + ~uVar4) * 8 + 8);
      }
      b->used = uVar1;
      b->sign = a->sign;
      iVar3 = 0;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

int mp_copy (mp_int * a, mp_int * b)
{
  int     res, n;

  /* if dst == src do nothing */
  if (a == b) {
    return MP_OKAY;
  }

  /* grow dest */
  if (b->alloc < a->used) {
     if ((res = mp_grow (b, a->used)) != MP_OKAY) {
        return res;
     }
  }

  /* zero b and copy the parameters over */
  {
    register mp_digit *tmpa, *tmpb;

    /* pointer aliases */

    /* source */
    tmpa = a->dp;

    /* destination */
    tmpb = b->dp;

    /* copy all the digits */
    for (n = 0; n < a->used; n++) {
      *tmpb++ = *tmpa++;
    }

    /* clear high digits */
    for (; n < b->used; n++) {
      *tmpb++ = 0;
    }
  }

  /* copy used count and sign */
  b->used = a->used;
  b->sign = a->sign;
  return MP_OKAY;
}